

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

void __thiscall
testing::Action<solitaire::interfaces::Solitaire_&()>::Action
          (Action<solitaire::interfaces::Solitaire_&()> *this,
          ActionInterface<solitaire::interfaces::Solitaire_&()> *impl)

{
  __shared_ptr<testing::ActionInterface<solitaire::interfaces::Solitaire&()>,(__gnu_cxx::_Lock_policy)2>
  local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::
  __shared_ptr<testing::ActionInterface<solitaire::interfaces::Solitaire&()>,(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr<testing::ActionInterface<solitaire::interfaces::Solitaire&()>,void>(local_20,impl);
  std::function<solitaire::interfaces::Solitaire&()>::
  function<testing::Action<solitaire::interfaces::Solitaire&()>::ActionAdapter,void>
            ((function<solitaire::interfaces::Solitaire&()> *)this,(ActionAdapter *)local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return;
}

Assistant:

explicit Action(ActionInterface<F>* impl)
      : fun_(ActionAdapter{::std::shared_ptr<ActionInterface<F>>(impl)}) {}